

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O3

BOOL MoveFileExW(LPCWSTR lpExistingFileName,LPCWSTR lpNewFileName,DWORD dwFlags)

{
  SIZE_T *lpMultiByteStr;
  long lVar1;
  undefined8 lpNewFileName_00;
  BOOL BVar2;
  DWORD DVar3;
  void *pvVar4;
  size_t sVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  long in_FS_OFFSET;
  undefined1 local_b8 [8];
  PathCharString destPS;
  PathCharString sourcePS;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lpMultiByteStr = &destPS.m_count;
  destPS._32_8_ = local_b8;
  destPS.m_size = 0;
  if (!PAL_InitializeChakraCoreCalled) goto LAB_00329ebb;
  pvVar4 = pthread_getspecific(CorUnix::thObjKey);
  if (pvVar4 == (void *)0x0) {
    CreateCurrentThreadData();
  }
  if (lpExistingFileName == (LPCWSTR)0x0) {
    iVar8 = 0;
  }
  else {
    sVar5 = PAL_wcslen(lpExistingFileName);
    iVar8 = ((int)sVar5 + 1) * MaxWCharToAcpLengthFactor;
  }
  StackString<32UL,_char>::Resize((StackString<32UL,_char> *)&destPS.m_count,(long)iVar8);
  iVar7 = 8;
  if (lpMultiByteStr == (SIZE_T *)0x0) {
LAB_00329e6e:
    piVar6 = __errno_location();
    *piVar6 = iVar7;
    BVar2 = 0;
  }
  else {
    iVar8 = WideCharToMultiByte(0,0,lpExistingFileName,-1,(LPSTR)lpMultiByteStr,iVar8,(LPCSTR)0x0,
                                (LPBOOL)0x0);
    destPS.m_count._0_1_ = 0;
    if (iVar8 == 0) {
      DVar3 = GetLastError();
      if (DVar3 == 0x7a) {
LAB_00329e13:
        iVar7 = 0xce;
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_00329ebb;
      }
      else {
        fprintf(_stderr,"] %s %s:%d","MoveFileExW",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
                ,0x648);
        iVar7 = 0x54f;
        fprintf(_stderr,"WideCharToMultiByte failure! error is %d\n",(ulong)DVar3);
      }
      goto LAB_00329e6e;
    }
    if (lpNewFileName == (LPCWSTR)0x0) {
      iVar8 = 0;
    }
    else {
      sVar5 = PAL_wcslen(lpNewFileName);
      iVar8 = ((int)sVar5 + 1) * MaxWCharToAcpLengthFactor;
    }
    StackString<32UL,_char>::Resize((StackString<32UL,_char> *)local_b8,(long)iVar8);
    lpNewFileName_00 = destPS._32_8_;
    if (destPS._32_8_ == 0) goto LAB_00329e6e;
    iVar8 = WideCharToMultiByte(0,0,lpNewFileName,-1,(LPSTR)destPS._32_8_,iVar8,(LPCSTR)0x0,
                                (LPBOOL)0x0);
    if ((ulong)(long)iVar8 < destPS.m_size) {
      destPS.m_size = (long)iVar8;
    }
    *(undefined1 *)(destPS._32_8_ + destPS.m_size) = 0;
    if (iVar8 == 0) {
      DVar3 = GetLastError();
      if (DVar3 == 0x7a) goto LAB_00329e13;
      fprintf(_stderr,"] %s %s:%d","MoveFileExW",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
              ,0x668);
      iVar7 = 0x54f;
      fprintf(_stderr,"WideCharToMultiByte failure! error is %d\n",(ulong)DVar3);
      goto LAB_00329e6e;
    }
    BVar2 = MoveFileExA((LPCSTR)lpMultiByteStr,(LPCSTR)lpNewFileName_00,dwFlags);
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)local_b8);
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)&destPS.m_count);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return BVar2;
    }
    __stack_chk_fail();
  }
LAB_00329ebb:
  abort();
}

Assistant:

BOOL
PALAPI
MoveFileExW(
        IN LPCWSTR lpExistingFileName,
        IN LPCWSTR lpNewFileName,
        IN DWORD dwFlags)
{
    CPalThread *pThread;
    PathCharString sourcePS;
    PathCharString destPS;
    char * source;
    char * dest;
    int length = 0;
    int     src_size,dest_size;
    BOOL        bRet = FALSE;

    PERF_ENTRY(MoveFileExW);
    ENTRY("MoveFileExW(lpExistingFileName=%p (%S), lpNewFileName=%p (%S), dwFlags=%#x)\n",
          lpExistingFileName?lpExistingFileName:W16_NULLSTRING,
          lpExistingFileName?lpExistingFileName:W16_NULLSTRING,
          lpNewFileName?lpNewFileName:W16_NULLSTRING,
          lpNewFileName?lpNewFileName:W16_NULLSTRING, dwFlags);

    pThread = InternalGetCurrentThread();
    
    if (lpExistingFileName != NULL)
    {
        length = (PAL_wcslen(lpExistingFileName)+1) * MaxWCharToAcpLengthFactor;
    }
    
    source = sourcePS.OpenStringBuffer(length);
    if (NULL == source)
    {
        pThread->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        goto done;
    }
    src_size = WideCharToMultiByte( CP_ACP, 0, lpExistingFileName, -1, source, length,
                                NULL, NULL );
    sourcePS.CloseBuffer(src_size);
    if( src_size == 0 )
    {
        DWORD dwLastError = GetLastError();
        if( dwLastError == ERROR_INSUFFICIENT_BUFFER )
        {
            WARN("lpExistingFileName is larger than MAX_LONGPATH (%d)!\n", MAX_LONGPATH);
            pThread->SetLastError(ERROR_FILENAME_EXCED_RANGE);
        }
        else
        {
            ASSERT("WideCharToMultiByte failure! error is %d\n", dwLastError);
            pThread->SetLastError(ERROR_INTERNAL_ERROR);
        }
        goto done;
    }

    length = 0;
    if (lpNewFileName != NULL)
    {
        length = (PAL_wcslen(lpNewFileName)+1) * MaxWCharToAcpLengthFactor;
    }
    
    dest = destPS.OpenStringBuffer(length);
    if (NULL == dest)
    {
        pThread->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        goto done;
    }
    dest_size = WideCharToMultiByte( CP_ACP, 0, lpNewFileName, -1, dest, length,
                                NULL, NULL );
    destPS.CloseBuffer(dest_size);
    
    if( dest_size == 0 )
    {
        DWORD dwLastError = GetLastError();
        if( dwLastError == ERROR_INSUFFICIENT_BUFFER )
        {
            WARN("lpNewFileName is larger than MAX_LONGPATH (%d)!\n", MAX_LONGPATH);
            pThread->SetLastError(ERROR_FILENAME_EXCED_RANGE);
        }
        else
        {
            ASSERT("WideCharToMultiByte failure! error is %d\n", dwLastError);
            pThread->SetLastError(ERROR_INTERNAL_ERROR);
        }
        goto done;
    }

    bRet = MoveFileExA(source,dest,dwFlags);

done:
    LOGEXIT("MoveFileExW returns BOOL %d\n", bRet);
    PERF_EXIT(MoveFileExW);
    return bRet;
}